

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

LY_ERR ly_ctx_new_yldata(char *search_dir,lyd_node *tree,int options,ly_ctx **ctx)

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  int iVar3;
  lyd_node *plVar4;
  char *pcVar5;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  lys_module *plVar9;
  LY_ERR LVar10;
  ly_ctx *plVar11;
  uint32_t uVar12;
  ulong uVar13;
  ly_ctx **pplVar14;
  ly_ctx *ctx_new;
  ly_ctx **local_80;
  LY_ERR local_74;
  ly_set *set;
  ly_ctx *local_68;
  ulong local_60;
  ly_set features;
  ly_set local_48;
  ly_set *set_1;
  
  set = (ly_set *)0x0;
  features.size = 0;
  features.count = 0;
  features.field_2.dnodes = (lyd_node **)0x0;
  ctx_new = (ly_ctx *)0x0;
  if (tree == (lyd_node *)0x0) {
    pcVar5 = "tree";
  }
  else {
    if (ctx != (ly_ctx **)0x0) {
      plVar11 = *ctx;
      if ((*ctx != (ly_ctx *)0x0) ||
         (LVar2 = ly_ctx_new(search_dir,(uint16_t)options,&ctx_new), pplVar14 = ctx,
         plVar11 = ctx_new, LVar2 == LY_SUCCESS)) {
        ctx_new = plVar11;
        LVar10 = options & LY_EPLUGIN;
        if (LVar10 == LY_SUCCESS) {
          ctx_new->flags = ctx_new->flags | 0x80;
        }
        LVar2 = lyd_find_xpath(tree,"/ietf-yang-library:yang-library/module-set[1]/module",&set);
        plVar11 = ctx_new;
        pplVar14 = ctx;
        if (LVar2 == LY_SUCCESS) {
          if (set->count == 0) {
            local_48.size = 0;
            local_48.count = 0;
            local_48.field_2.dnodes = (lyd_node **)0x0;
            LVar2 = lyd_find_xpath(tree,"/ietf-yang-library:yang-library/modules-state/module",
                                   &set_1);
            pplVar14 = ctx;
            if (LVar2 == LY_SUCCESS) {
              local_68 = plVar11;
              uVar13 = 0;
              local_80 = ctx;
              local_74 = LVar10;
              while (uVar13 < set_1->count) {
                local_60 = uVar13;
                plVar4 = lyd_child((set_1->field_2).dnodes[uVar13]);
                pcVar5 = (char *)0x0;
                pcVar6 = (char *)0x0;
                for (; plVar4 != (lyd_node *)0x0; plVar4 = plVar4->next) {
                  pcVar8 = plVar4->schema->name;
                  iVar3 = strcmp(pcVar8,"name");
                  if (iVar3 == 0) {
                    pcVar5 = lyd_get_value(plVar4);
                  }
                  else {
                    iVar3 = strcmp(pcVar8,"revision");
                    if (iVar3 == 0) {
                      pcVar6 = lyd_get_value(plVar4);
                    }
                    else {
                      iVar3 = strcmp(pcVar8,"feature");
                      if (iVar3 == 0) {
                        LVar2 = ly_set_add(&local_48,plVar4,'\0',(uint32_t *)0x0);
                        if (LVar2 != LY_SUCCESS) goto LAB_0011b2d5;
                      }
                      else {
                        iVar3 = strcmp(pcVar8,"conformance-type");
                        if (iVar3 == 0) {
                          pcVar8 = lyd_get_value(plVar4);
                          iVar3 = strcmp(pcVar8,"import");
                          if (iVar3 == 0) goto LAB_0011b2a8;
                        }
                      }
                    }
                  }
                }
                uVar12 = local_48.count;
                ppcVar7 = (char **)malloc((ulong)(local_48.count + 1) << 3);
                if (ppcVar7 == (char **)0x0) {
                  LVar2 = LY_EMEM;
                  goto LAB_0011b2d5;
                }
                for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
                  pcVar8 = lyd_get_value(local_48.field_2.dnodes[uVar13]);
                  ppcVar7[uVar13] = pcVar8;
                  uVar12 = local_48.count;
                }
                ppcVar7[uVar12] = (char *)0x0;
                ly_set_clean(&local_48,free);
                plVar11 = local_68;
                plVar9 = ly_ctx_load_module(local_68,pcVar5,pcVar6,ppcVar7);
                free(ppcVar7);
                if (plVar9 == (lys_module *)0x0) {
                  LVar2 = LY_EINVAL;
                  ly_log(plVar11,LY_LLERR,LY_EINVAL,
                         "Unable to load module specified by yang library data.");
                  goto LAB_0011b2e6;
                }
LAB_0011b2a8:
                uVar13 = local_60 + 1;
              }
              LVar2 = LY_SUCCESS;
LAB_0011b2d5:
              ly_set_clean(&local_48,free);
LAB_0011b2e6:
              pplVar14 = local_80;
              ly_set_free(set_1,free);
              if (LVar2 == LY_SUCCESS) {
LAB_0011b301:
                LVar2 = ly_ctx_compile(ctx_new);
                local_74 = local_74 | LVar2;
                if (local_74 == LY_SUCCESS) {
                  ctx_new->flags = ctx_new->flags & 0xff7f;
                  LVar2 = LY_SUCCESS;
                }
              }
            }
          }
          else {
            uVar13 = 0;
            local_80 = ctx;
            local_74 = LVar10;
            local_68 = (ly_ctx *)tree;
            do {
              pplVar14 = local_80;
              if (set->count <= uVar13) goto LAB_0011b301;
              local_60 = uVar13;
              plVar4 = lyd_child((set->field_2).dnodes[uVar13]);
              pcVar6 = (char *)0x0;
              pcVar5 = (char *)0x0;
              for (; plVar4 != (lyd_node *)0x0; plVar4 = plVar4->next) {
                pcVar8 = plVar4->schema->name;
                iVar3 = strcmp(pcVar8,"name");
                if (iVar3 == 0) {
                  pcVar5 = lyd_get_value(plVar4);
                }
                else {
                  iVar3 = strcmp(pcVar8,"revision");
                  if (iVar3 == 0) {
                    pcVar6 = lyd_get_value(plVar4);
                  }
                  else {
                    iVar3 = strcmp(pcVar8,"feature");
                    if ((iVar3 == 0) &&
                       (LVar2 = ly_set_add(&features,plVar4,'\0',(uint32_t *)0x0),
                       pplVar14 = local_80, LVar2 != LY_SUCCESS)) goto LAB_0011b313;
                  }
                }
              }
              uVar12 = features.count;
              ppcVar7 = (char **)malloc((ulong)(features.count + 1) << 3);
              if (ppcVar7 == (char **)0x0) {
                LVar2 = LY_EMEM;
                pplVar14 = local_80;
                goto LAB_0011b313;
              }
              for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
                pcVar8 = lyd_get_value(features.field_2.dnodes[uVar13]);
                ppcVar7[uVar13] = pcVar8;
                uVar12 = features.count;
              }
              ppcVar7[uVar12] = (char *)0x0;
              ly_set_clean(&features,(_func_void_void_ptr *)0x0);
              plVar9 = ly_ctx_load_module(ctx_new,pcVar5,pcVar6,ppcVar7);
              free(ppcVar7);
              pplVar14 = local_80;
              uVar13 = local_60 + 1;
            } while (plVar9 != (lys_module *)0x0);
            plVar11 = *local_80;
            if (plVar11 == (ly_ctx *)0x0) {
              plVar1 = (lysc_node *)(local_68->dict).lock.__align;
              if (plVar1 == (lysc_node *)0x0) {
                plVar9 = (lys_module *)&(local_68->unres).implementing.field_2;
              }
              else {
                plVar9 = plVar1->module;
              }
              plVar11 = plVar9->ctx;
            }
            pcVar8 = "<none>";
            if (pcVar6 != (char *)0x0) {
              pcVar8 = pcVar6;
            }
            LVar2 = LY_EINVAL;
            ly_log(plVar11,LY_LLERR,LY_EINVAL,
                   "Unable to load module %s@%s specified by yang library data.",pcVar5,pcVar8);
          }
        }
      }
LAB_0011b313:
      ly_set_free(set,(_func_void_void_ptr *)0x0);
      ly_set_erase(&features,(_func_void_void_ptr *)0x0);
      if (*pplVar14 != (ly_ctx *)0x0) {
        return LVar2;
      }
      *pplVar14 = ctx_new;
      if (LVar2 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      ly_ctx_destroy(ctx_new);
      *pplVar14 = (ly_ctx *)0x0;
      return LVar2;
    }
    pcVar5 = "ctx";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"ly_ctx_new_yldata");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_yldata(const char *search_dir, const struct lyd_node *tree, int options, struct ly_ctx **ctx)
{
    const char *name = NULL, *revision = NULL;
    struct lyd_node *module, *node;
    struct ly_set *set = NULL;
    const char **feature_arr = NULL;
    struct ly_set features = {0};
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *mod;
    struct ly_ctx *ctx_new = NULL;
    ly_bool no_expl_compile = 0;
    uint32_t i, j;

    LY_CHECK_ARG_RET(NULL, tree, ctx, LY_EINVAL);

    /* create a new context */
    if (*ctx == NULL) {
        LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, options, &ctx_new), cleanup);
    } else {
        ctx_new = *ctx;
    }

    /* redundant to compile modules one-by-one */
    if (!(options & LY_CTX_EXPLICIT_COMPILE)) {
        ctx_new->flags |= LY_CTX_EXPLICIT_COMPILE;
        no_expl_compile = 1;
    }

    LY_CHECK_GOTO(ret = lyd_find_xpath(tree, "/ietf-yang-library:yang-library/module-set[1]/module", &set), cleanup);
    if (set->count == 0) {
        /* perhaps a legacy data tree? */
        LY_CHECK_GOTO(ret = ly_ctx_new_yl_legacy(ctx_new, tree), cleanup);
    } else {
        /* process the data tree */
        for (i = 0; i < set->count; ++i) {
            module = set->dnodes[i];

            /* initiate */
            name = NULL;
            revision = NULL;

            /* iterate over data */
            LY_LIST_FOR(lyd_child(module), node) {
                if (!strcmp(node->schema->name, "name")) {
                    name = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "revision")) {
                    revision = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "feature")) {
                    LY_CHECK_GOTO(ret = ly_set_add(&features, node, 0, NULL), cleanup);
                }
            }

            feature_arr = malloc((features.count + 1) * sizeof *feature_arr);
            LY_CHECK_ERR_GOTO(!feature_arr, ret = LY_EMEM, cleanup);

            /* parse features into an array of strings */
            for (j = 0; j < features.count; ++j) {
                feature_arr[j] = lyd_get_value(features.dnodes[j]);
            }
            feature_arr[features.count] = NULL;
            ly_set_clean(&features, NULL);

            /* use the gathered data to load the module */
            mod = ly_ctx_load_module(ctx_new, name, revision, feature_arr);
            free(feature_arr);
            if (!mod) {
                LOGERR(*ctx ? *ctx : LYD_CTX(tree), LY_EINVAL, "Unable to load module %s@%s specified by yang library data.",
                        name, revision ? revision : "<none>");
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* compile */
    LY_CHECK_GOTO(ret = ly_ctx_compile(ctx_new), cleanup);

    if (no_expl_compile) {
        /* unset flag */
        ctx_new->flags &= ~LY_CTX_EXPLICIT_COMPILE;
    }

cleanup:
    ly_set_free(set, NULL);
    ly_set_erase(&features, NULL);
    if (*ctx == NULL) {
        *ctx = ctx_new;
        if (ret) {
            ly_ctx_destroy(*ctx);
            *ctx = NULL;
        }
    }
    return ret;
}